

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

UChar * u_memchr_63(UChar *s,UChar c,int32_t count)

{
  UChar *limit;
  int32_t count_local;
  UChar c_local;
  UChar *s_local;
  
  if (count < 1) {
    s_local = (UChar *)0x0;
  }
  else {
    _count_local = s;
    if ((c & 0xf800U) == 0xd800) {
      limit._0_4_ = count;
      limit._6_2_ = c;
      s_local = u_strFindFirst_63(s,count,(UChar *)((long)&limit + 6),1);
    }
    else {
      do {
        if (*_count_local == c) {
          return _count_local;
        }
        _count_local = _count_local + 1;
      } while (_count_local != s + count);
      s_local = (UChar *)0x0;
    }
  }
  return s_local;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_memchr(const UChar *s, UChar c, int32_t count) {
    if(count<=0) {
        return NULL; /* no string */
    } else if(U16_IS_SURROGATE(c)) {
        /* make sure to not find half of a surrogate pair */
        return u_strFindFirst(s, count, &c, 1);
    } else {
        /* trivial search for a BMP code point */
        const UChar *limit=s+count;
        do {
            if(*s==c) {
                return (UChar *)s;
            }
        } while(++s!=limit);
        return NULL;
    }
}